

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_func.c
# Opt level: O0

void lj_func_closeuv(lua_State *L,TValue *level)

{
  uint uVar1;
  ulong in_RSI;
  long in_RDI;
  GCobj *o;
  global_State *g;
  GCupval *uv;
  global_State *in_stack_ffffffffffffffc8;
  undefined7 in_stack_ffffffffffffffd0;
  undefined1 uVar2;
  GCupval *local_18;
  
  uVar1 = *(uint *)(in_RDI + 8);
  while( true ) {
    uVar2 = false;
    if (*(int *)(in_RDI + 0x28) != 0) {
      local_18 = (GCupval *)(ulong)*(uint *)(in_RDI + 0x28);
      uVar2 = in_RSI <= (local_18->v).ptr32;
    }
    if ((bool)uVar2 == false) break;
    *(uint32_t *)(in_RDI + 0x28) = (local_18->nextgc).gcptr32;
    if ((local_18->marked & ((((global_State *)(ulong)uVar1)->gc).currentwhite ^ 3) & 3) == 0) {
      unlinkuv((global_State *)(ulong)uVar1,local_18);
      lj_gc_closeuv((global_State *)CONCAT17(uVar2,in_stack_ffffffffffffffd0),
                    (GCupval *)in_stack_ffffffffffffffc8);
    }
    else {
      lj_func_freeuv(in_stack_ffffffffffffffc8,(GCupval *)0x11be5e);
    }
  }
  return;
}

Assistant:

void LJ_FASTCALL lj_func_closeuv(lua_State *L, TValue *level)
{
  GCupval *uv;
  global_State *g = G(L);
  while (gcref(L->openupval) != NULL &&
	 uvval((uv = gco2uv(gcref(L->openupval)))) >= level) {
    GCobj *o = obj2gco(uv);
    lj_assertG(!isblack(o), "bad black upvalue");
    lj_assertG(!uv->closed && uvval(uv) != &uv->tv, "closed upvalue in chain");
    setgcrefr(L->openupval, uv->nextgc);  /* No longer in open list. */
    if (isdead(g, o)) {
      lj_func_freeuv(g, uv);
    } else {
      unlinkuv(g, uv);
      lj_gc_closeuv(g, uv);
    }
  }
}